

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-writable-after-shutdown.c
# Opt level: O3

int run_test_not_writable_after_shutdown(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *unaff_RBX;
  long *plVar2;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_connect_t connect_req;
  uv_tcp_t socket;
  long lStack_178;
  uv_loop_t *puStack_170;
  long local_168;
  long local_160;
  sockaddr_in local_158;
  uv_connect_t local_148;
  uv_tcp_t local_e0;
  
  plVar2 = &local_168;
  puStack_170 = (uv_loop_t *)0x1ab44a;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_158);
  local_e0.data = (void *)(long)iVar1;
  local_148.data = (void *)0x0;
  if (local_e0.data == (void *)0x0) {
    puStack_170 = (uv_loop_t *)0x1ab475;
    unaff_RBX = uv_default_loop();
    puStack_170 = (uv_loop_t *)0x1ab488;
    iVar1 = uv_tcp_init(unaff_RBX,&local_e0);
    local_148.data = (void *)(long)iVar1;
    local_168 = 0;
    if (local_148.data != (void *)0x0) goto LAB_001ab565;
    puStack_170 = (uv_loop_t *)0x1ab4c4;
    iVar1 = uv_tcp_connect(&local_148,&local_e0,(sockaddr *)&local_158,connect_cb);
    local_168 = (long)iVar1;
    local_160 = 0;
    if (local_168 != 0) goto LAB_001ab572;
    puStack_170 = (uv_loop_t *)0x1ab4ec;
    iVar1 = uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_168 = (long)iVar1;
    local_160 = 0;
    if (local_168 != 0) goto LAB_001ab57f;
    puStack_170 = (uv_loop_t *)0x1ab517;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_170 = (uv_loop_t *)0x1ab521;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    local_168 = 0;
    puStack_170 = (uv_loop_t *)0x1ab531;
    iVar1 = uv_loop_close(unaff_RBX);
    local_160 = (long)iVar1;
    if (local_168 == local_160) {
      puStack_170 = (uv_loop_t *)0x1ab548;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_170 = (uv_loop_t *)0x1ab565;
    run_test_not_writable_after_shutdown_cold_1();
LAB_001ab565:
    puStack_170 = (uv_loop_t *)0x1ab572;
    run_test_not_writable_after_shutdown_cold_2();
LAB_001ab572:
    puStack_170 = (uv_loop_t *)0x1ab57f;
    run_test_not_writable_after_shutdown_cold_3();
LAB_001ab57f:
    puStack_170 = (uv_loop_t *)0x1ab58c;
    run_test_not_writable_after_shutdown_cold_4();
  }
  iVar1 = (int)&local_160;
  puStack_170 = (uv_loop_t *)connect_cb;
  run_test_not_writable_after_shutdown_cold_5();
  lStack_178 = (long)iVar1;
  puStack_170 = unaff_RBX;
  if (lStack_178 == 0) {
    iVar1 = uv_shutdown(&shutdown_req,*(uv_stream_t **)((long)plVar2 + 0x50),shutdown_cb);
    lStack_178 = (long)iVar1;
    if (lStack_178 == 0) {
      iVar1 = uv_is_writable(*(uv_stream_t **)((long)plVar2 + 0x50));
      lStack_178 = (long)iVar1;
      if (lStack_178 == 0) {
        return iVar1;
      }
      goto LAB_001ab630;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001ab630:
  plVar2 = &lStack_178;
  connect_cb_cold_3();
  uv_close((uv_handle_t *)plVar2[9],close_cb);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(not_writable_after_shutdown) {
  int r;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_tcp_t socket;
  uv_connect_t connect_req;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_tcp_init(loop, &socket);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &socket,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}